

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

void __thiscall
helics::apps::Clone::captureForCurrentTime(Clone *this,Time currentTime,int iteration)

{
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  bool bVar1;
  int16_t iVar2;
  mapped_type *pmVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string valstr;
  int subid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  Input *sub;
  iterator __end2;
  iterator __begin2;
  deque<helics::Input,_std::allocator<helics::Input>_> *__range2;
  Input *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  Input *in_stack_fffffffffffffad0;
  Input *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  string *in_stack_fffffffffffffaf0;
  key_type *__k;
  undefined4 in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  Core *local_4d8;
  double local_4d0;
  _Alloc_hider local_4c8;
  size_type local_4c0;
  undefined1 local_4b8 [32];
  void *local_498;
  double local_490;
  char *local_488;
  undefined8 local_480;
  undefined1 local_478 [32];
  undefined8 local_458;
  char *local_450;
  undefined8 local_448;
  undefined1 local_440 [32];
  pointer local_420;
  pointer local_418;
  pointer local_410;
  BaseType local_3b8;
  mapped_type local_3b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  reference local_390;
  _Self local_388;
  _Self local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  int local_33c [5];
  pointer local_328 [2];
  int local_318 [12];
  undefined8 local_2e8;
  pointer *local_2e0;
  pointer local_2d8;
  pointer in_stack_fffffffffffffd30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  double local_288 [6];
  undefined8 local_258;
  double *local_250;
  char *local_248;
  __index_type _Stack_240;
  undefined7 uStack_23f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  string *local_230;
  undefined8 *local_228;
  char *local_220;
  __index_type _Stack_218;
  undefined7 uStack_217;
  undefined1 *local_210;
  double local_208 [2];
  undefined1 local_1f8 [32];
  void *local_1d8 [2];
  undefined8 local_1c8;
  double *local_1c0;
  char *local_1b8;
  int32_t iStack_1b0;
  undefined4 uStack_1ac;
  void **local_1a0;
  string *local_198;
  int *local_190;
  double *local_188;
  char *local_180;
  int32_t iStack_178;
  undefined4 uStack_174;
  undefined1 *local_170;
  double local_168 [4];
  Core *local_148 [2];
  undefined8 local_138;
  double *local_130;
  char *local_128;
  size_type sStack_120;
  Core **local_110;
  Input *local_108;
  double *local_100;
  char *local_f8;
  size_type sStack_f0;
  undefined1 *local_e8;
  double local_e0;
  double *local_d8;
  double local_d0;
  double *local_c8;
  double local_c0;
  double *local_b8;
  pointer local_b0;
  pointer *local_a8;
  undefined1 *local_98;
  int *local_88;
  pointer *local_80;
  undefined8 *local_78;
  double *local_70;
  undefined8 *local_68;
  Core *local_60;
  Core **local_58;
  void *local_50;
  void **local_48;
  double *local_40;
  undefined8 *local_38;
  void *local_30;
  void **local_28;
  Core *local_20;
  Core **local_18;
  double *local_10;
  undefined8 *local_8;
  
  local_348 = &in_RDI[6].field_2;
  local_33c[0] = in_EDX;
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::begin
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffffac8);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::end
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffffac8);
  while (bVar1 = CLI::std::operator==(&local_368,&local_388), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_390 = CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::
                operator*(&local_368);
    bVar1 = Input::isUpdated(in_stack_fffffffffffffac8);
    if (bVar1) {
      Input::getValue<std::__cxx11::string>(in_stack_fffffffffffffad8);
      __k = (key_type *)((long)&in_RDI[10].field_2 + 8);
      local_3b8 = (BaseType)Interface::getHandle(&local_390->super_Interface);
      pmVar3 = CLI::std::
               map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
               ::operator[]((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
                             *)CONCAT44(local_3b8,in_stack_fffffffffffffb10),__k);
      local_3b4 = *pmVar3;
      std::
      vector<helics::apps::Clone::ValueCapture,std::allocator<helics::apps::Clone::ValueCapture>>::
      emplace_back<TimeRepresentation<count_time<9,long>>&,int_const&,std::__cxx11::string&>
                ((vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                  *)in_stack_fffffffffffffaf0,
                 (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffae8,
                 (int *)in_stack_fffffffffffffae0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffad8);
      if (0 < local_33c[0]) {
        iVar2 = (int16_t)local_33c[0];
        pvVar4 = CLI::std::
                 vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                 ::back((vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                         *)in_stack_fffffffffffffad0);
        pvVar4->iteration = iVar2;
      }
      if (((ulong)in_RDI[5]._M_dataplus._M_p & 0x100) != 0) {
        std::__cxx11::string::string(in_stack_fffffffffffffae0);
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(&local_3b0);
        if (sVar5 < 0x96) {
          if (local_33c[0] < 1) {
            local_450 = "[{}]value {}={}";
            local_448._0_1_ = '\x0f';
            local_448._1_7_ = 0;
            local_458 = TimeRepresentation::operator_cast_to_double
                                  ((TimeRepresentation<count_time<9,_long>_> *)0x420c41);
            in_stack_fffffffffffffae8 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffffad0);
            local_210 = local_440;
            local_220 = local_450;
            _Stack_218 = (__index_type)local_448;
            uStack_217 = local_448._1_7_;
            local_228 = &local_458;
            local_238 = &local_3b0;
            local_248 = local_450;
            _Stack_240 = (__index_type)local_448;
            uStack_23f = local_448._1_7_;
            local_c0 = (double)local_458;
            local_b8 = local_288;
            local_288[0] = (double)local_458;
            local_230 = in_stack_fffffffffffffae8;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffffae0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffad8);
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffffae0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffad8);
            local_68 = &local_258;
            local_70 = local_288;
            local_258 = 0xdda;
            fmt_00.size_ = (size_t)in_stack_fffffffffffffd48;
            fmt_00.data_ = (char *)in_stack_fffffffffffffd40;
            args_00.field_1.values_ = in_stack_fffffffffffffd38.values_;
            args_00.desc_ = (unsigned_long_long)in_stack_fffffffffffffd30;
            local_250 = local_70;
            ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffb20,in_RDI);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffad0);
          }
          else {
            local_418 = (pointer)0x806b40;
            local_410 = (pointer)0x12;
            local_420 = (pointer)TimeRepresentation::operator_cast_to_double
                                           ((TimeRepresentation<count_time<9,_long>_> *)0x420a2c);
            in_stack_fffffffffffffaf0 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffffad0);
            in_stack_fffffffffffffd40 = &local_3b0;
            local_2d8 = local_418;
            local_b0 = local_420;
            local_a8 = local_328;
            local_328[0] = local_420;
            local_88 = local_318;
            local_318[0] = local_33c[0];
            in_stack_fffffffffffffd30 = local_410;
            in_stack_fffffffffffffd48 = in_stack_fffffffffffffaf0;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffffae0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffad8);
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffffae0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffad8);
            local_78 = &local_2e8;
            local_80 = local_328;
            local_2e8 = 0xdd1a;
            fmt.size_ = (size_t)in_stack_fffffffffffffd48;
            fmt.data_ = (char *)in_stack_fffffffffffffd40;
            args.field_1.values_ = in_stack_fffffffffffffd38.values_;
            args.desc_ = (unsigned_long_long)in_stack_fffffffffffffd30;
            local_2e0 = local_80;
            ::fmt::v11::vformat_abi_cxx11_(fmt,args);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffb20,in_RDI);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffad0);
          }
        }
        else if (local_33c[0] < 1) {
          local_4c8._M_p = "[{}]value {}=block[{}]";
          local_4c0 = 0x16;
          local_4d0 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x421040);
          in_stack_fffffffffffffad8 =
               (Input *)Input::getTarget_abi_cxx11_(in_stack_fffffffffffffad0);
          local_4d8 = (Core *)std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              size(&local_3b0);
          local_e8 = local_4b8;
          local_f8 = local_4c8._M_p;
          sStack_f0 = local_4c0;
          local_100 = &local_4d0;
          local_110 = &local_4d8;
          local_128 = local_4c8._M_p;
          sStack_120 = local_4c0;
          local_e0 = local_4d0;
          local_d8 = local_168;
          local_168[0] = local_4d0;
          local_108 = in_stack_fffffffffffffad8;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffae0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffad8);
          local_58 = local_148;
          local_60 = *local_110;
          local_8 = &local_138;
          local_10 = local_168;
          local_138 = 0x4da;
          fmt_02.size_ = (size_t)in_stack_fffffffffffffd48;
          fmt_02.data_ = (char *)in_stack_fffffffffffffd40;
          args_02.field_1.values_ = in_stack_fffffffffffffd38.values_;
          args_02.desc_ = (unsigned_long_long)in_stack_fffffffffffffd30;
          local_20 = local_60;
          local_18 = local_58;
          local_148[0] = local_60;
          local_130 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(fmt_02,args_02);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffb20,in_RDI);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffad0);
        }
        else {
          local_488 = "[{}:{}]value {}=block[{}]";
          local_480._0_4_ = 0x19;
          local_480._4_4_ = 0;
          local_490 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x420dfc);
          in_stack_fffffffffffffae0 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffffad0);
          local_498 = (void *)std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              size(&local_3b0);
          local_170 = local_478;
          local_180 = local_488;
          iStack_178 = (int32_t)local_480;
          uStack_174 = local_480._4_4_;
          local_188 = &local_490;
          local_190 = local_33c;
          local_1a0 = &local_498;
          local_1b8 = local_488;
          iStack_1b0 = (int32_t)local_480;
          uStack_1ac = local_480._4_4_;
          local_d0 = local_490;
          local_c8 = local_208;
          local_208[0] = local_490;
          local_98 = local_1f8;
          local_198 = in_stack_fffffffffffffae0;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffae0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffad8);
          local_48 = local_1d8;
          local_50 = *local_1a0;
          local_38 = &local_1c8;
          local_40 = local_208;
          local_1c8 = 0x4d1a;
          fmt_01.size_ = (size_t)in_stack_fffffffffffffd48;
          fmt_01.data_ = (char *)in_stack_fffffffffffffd40;
          args_01.field_1.values_ = in_stack_fffffffffffffd38.values_;
          args_01.desc_ = (unsigned_long_long)in_stack_fffffffffffffd30;
          local_30 = local_50;
          local_28 = local_48;
          local_1d8[0] = local_50;
          local_1c0 = local_40;
          ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffb20,in_RDI);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffad0);
        }
        spdlog::info<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x421218);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffad0);
      }
      pvVar6 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)((long)&in_RDI[0x12].field_2 + 8),
                          (long)local_3b4);
      if (*pvVar6 == 0) {
        pvVar4 = CLI::std::
                 vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                 ::back((vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                         *)in_stack_fffffffffffffad0);
        pvVar4->first = true;
      }
      pvVar6 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)((long)&in_RDI[0x12].field_2 + 8),
                          (long)local_3b4);
      *pvVar6 = *pvVar6 + 1;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffad0);
    }
    CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::operator++
              ((_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*> *)
               in_stack_fffffffffffffad0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)
                     0x4212c0);
  if (bVar1) {
    while( true ) {
      CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::operator->
                ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)0x4212dc);
      bVar1 = Endpoint::hasMessage((Endpoint *)in_stack_fffffffffffffad0);
      if (!bVar1) break;
      __x = in_RDI + 10;
      CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::operator->
                ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)0x421308);
      in_stack_fffffffffffffad0 = (Input *)&stack0xfffffffffffffb20;
      Endpoint::getMessage((Endpoint *)in_stack_fffffffffffffad8);
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::push_back((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   *)in_stack_fffffffffffffad0,(value_type *)__x);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffae0);
    }
  }
  return;
}

Assistant:

void Clone::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();
            const int subid = subids[sub.getHandle()];
            points.emplace_back(currentTime, subid, val);
            if (iteration > 0) {
                points.back().iteration = iteration;
            }
            if (verbose) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                spdlog::info(valstr);
            }
            if (pubPointCount[subid] == 0) {
                points.back().first = true;
            }
            ++pubPointCount[subid];
        }
    }

    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            messages.push_back(cloneEndpoint->getMessage());
        }
    }
}